

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionContext_BlindTransaction_Test::
~ConfidentialTransactionContext_BlindTransaction_Test
          (ConfidentialTransactionContext_BlindTransaction_Test *this)

{
  void *in_RDI;
  
  ~ConfidentialTransactionContext_BlindTransaction_Test
            ((ConfidentialTransactionContext_BlindTransaction_Test *)0x1ec348);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, BlindTransaction)
{
  std::string tx_base =
      "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000000171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000";

  // blinding key
  // pubkey: '02283059264b09d28d56d440f11ab69c9af8f09dfd8b0c3b30acc545fc0a5c6d13',
  // privkey: '0245a1b3f51d6fe1c4bddc6764cf98a0fe50dba470b8b28c47485112c3f8c9b5'

  // set issue
  ConfidentialTransactionContext tx(tx_base);
  OutPoint outpoint(Txid("c678107274b4d235d0e587194914b72b37b6ccd268cffad3a40194db65a33d7f"), 1);
  Amount asset_amount = Amount::CreateByCoinAmount(100.0);
  Amount token_amount = Amount::CreateByCoinAmount(10.0);
  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  // pubkey: '023c10299d5e5e7586694f5bdf74535e4fdade72f266ed56f761cf7b1e4c61dad4',
  // privkey: 'cUbox87hNNTuqTACDBc6YKU2mA21Pqt6BjZGVogusp766QVxypKg'
  ElementsConfidentialAddress address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3ggeFikyDxDW5gU8WmTXtb2HWWjc23YXZz");
  // "2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z"
  ElementsConfidentialAddress asset_address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3VHXTF8dZAhKb1iBAnzYXEj527CSdfj2PS");
  // "2dqLgUheB1R4gw7G2DKuxBeMr1jdgxECAoG"
  ElementsConfidentialAddress token_address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3jM5PWewjAYfWsrxrGeKAxWw6JsEGLjWym");
  ByteData256 contract_hash;
  bool is_blind = true;
  IssuanceParameter param;
  IssuanceOutputParameter issue_output;
  IssuanceOutputParameter token_output;
  issue_output.confidential_address = asset_address;
  issue_output.amount = asset_amount;
  token_output.confidential_address = token_address;
  token_output.amount = token_amount;
  EXPECT_NO_THROW(
      (param = tx.SetAssetIssuance(outpoint, asset_amount,
                                   issue_output, token_amount,
                                   token_output, is_blind,
                                   contract_hash)));

  Privkey master_blinding_key("fbbd7894006dd0e02000eb6646c6685bcceddabc8d68b93e9a1a2c78d1e7bbec");
  IssuanceBlindingKeyPair issue_key;
  issue_key.asset_key = ConfidentialTransaction::GetIssuanceBlindingKey(
      master_blinding_key, outpoint.GetTxid(), outpoint.GetVout());
  issue_key.token_key = issue_key.asset_key;
  BlindParameter utxo_param;
  utxo_param.asset = ConfidentialAssetId("849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735");
  utxo_param.value = ConfidentialValue(Amount(int64_t{49980000}));

  std::map<OutPoint, BlindParameter> utxo_info_map;
  utxo_info_map.emplace(outpoint, utxo_param);
  std::map<OutPoint, IssuanceBlindingKeyPair> issuance_key_map;
  issuance_key_map.emplace(outpoint, issue_key);
  std::vector<ElementsConfidentialAddress> confidential_key_list;
  confidential_key_list.push_back(address);
  // confidential_key_list.push_back(asset_address);
  // confidential_key_list.push_back(token_address);
  EXPECT_NO_THROW(tx.BlindTransaction(
      utxo_info_map, issuance_key_map, confidential_key_list));
  EXPECT_EQ(tx.GetHex().size(), 43998);
  std::vector<ConfidentialTxOutReference> txouts = tx.GetTxOutList();
  EXPECT_EQ(txouts.size(), 4);
  if (txouts.size() == 4) {
    EXPECT_TRUE(txouts[0].GetConfidentialValue().HasBlinding());
    EXPECT_FALSE(txouts[1].GetConfidentialValue().HasBlinding());
    EXPECT_TRUE(txouts[2].GetConfidentialValue().HasBlinding());
    EXPECT_TRUE(txouts[3].GetConfidentialValue().HasBlinding());
  }
  // EXPECT_STREQ(tx.GetHex().c_str(), "");

  std::vector<UnblindParameter> unblind_param;
  EXPECT_NO_THROW(unblind_param = tx.UnblindIssuance(outpoint, issue_key));
  EXPECT_STREQ(unblind_param[0].asset.GetHex().c_str(), param.asset.GetHex().c_str());
  EXPECT_EQ(unblind_param[0].value.GetAmount().GetSatoshiValue(), asset_amount.GetSatoshiValue());
  EXPECT_STREQ(unblind_param[1].asset.GetHex().c_str(), param.token.GetHex().c_str());
  EXPECT_EQ(unblind_param[1].value.GetAmount().GetSatoshiValue(), token_amount.GetSatoshiValue());
}